

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_lxvdsx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 val;
  TCGv_i64 ret;
  TCGv_i64 EA_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    val = tcg_temp_new_i64(tcg_ctx_00);
    ret = tcg_temp_new_i64(tcg_ctx_00);
    gen_set_access_type(ctx,0x20);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    gen_qemu_ld64_i64(ctx,val,EA_00);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,val);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,val);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1,ret);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,val);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_lxvdsx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    gen_qemu_ld64_i64(ctx, t0, EA);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);
    tcg_gen_mov_i64(tcg_ctx, t1, t0);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t1);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}